

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O0

string * __thiscall RegressionTree::dynamicFunctionsGenerator_abi_cxx11_(RegressionTree *this)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  Attribute *pAVar4;
  TDNode *pTVar5;
  string *in_RDI;
  string *this_00;
  string evalFunction;
  string findPrediction;
  string *varName_1;
  size_t var_3;
  string findPredSwitch;
  string loadFunction;
  string testTuple;
  Attribute *att_1;
  size_t var_2;
  string attrConstruct;
  string attributeString;
  string genDynFuncs;
  string headerFiles;
  Attribute *att;
  size_t var_1;
  var_bitset *bag;
  size_t rel;
  string conditionsString;
  string varTypeList;
  string relationName;
  string varName;
  size_t var;
  string relationMap;
  string varList;
  string condition [2];
  size_t in_stack_ffffffffffffdc58;
  TreeDecomposition *in_stack_ffffffffffffdc60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdc68;
  TreeDecomposition *in_stack_ffffffffffffdc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdc80;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdc90;
  Application *in_stack_ffffffffffffdc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdca0;
  ulong uVar7;
  Application *in_stack_ffffffffffffdca8;
  string local_2258 [32];
  string local_2238 [32];
  string local_2218 [32];
  string local_21f8 [32];
  string local_21d8 [32];
  string local_21b8 [32];
  string local_2198 [32];
  string local_2178 [32];
  string local_2158 [32];
  string local_2138 [32];
  string local_2118 [32];
  string local_20f8 [32];
  string local_20d8 [32];
  string local_20b8 [32];
  string local_2098 [32];
  string local_2078 [32];
  string local_2058 [32];
  string local_2038 [32];
  string local_2018 [32];
  string local_1ff8 [32];
  string local_1fd8 [32];
  string local_1fb8 [32];
  string local_1f98 [32];
  string local_1f78 [32];
  string local_1f58 [32];
  string local_1f38 [32];
  string local_1f18 [32];
  string local_1ef8 [32];
  string local_1ed8 [32];
  string local_1eb8 [32];
  string local_1e98 [32];
  string local_1e78 [32];
  string local_1e58 [32];
  string local_1e38 [32];
  string local_1e18 [32];
  string local_1df8 [32];
  string local_1dd8 [32];
  string local_1db8 [32];
  string local_1d98 [32];
  string local_1d78 [32];
  string local_1d58 [32];
  string local_1d38 [32];
  string local_1d18 [32];
  string local_1cf8 [32];
  string local_1cd8 [32];
  string local_1cb8 [32];
  string local_1c98 [32];
  string local_1c78 [32];
  string local_1c58 [32];
  string local_1c38 [32];
  string local_1c18 [32];
  string local_1bf8 [32];
  string local_1bd8 [32];
  string local_1bb8 [32];
  string local_1b98 [32];
  string local_1b78 [32];
  string local_1b58 [32];
  string local_1b38 [32];
  string local_1b18 [32];
  string local_1af8 [32];
  string local_1ad8 [32];
  string local_1ab8 [32];
  string local_1a98 [32];
  string local_1a78 [32];
  string local_1a58 [32];
  string local_1a38 [32];
  string local_1a18 [32];
  string local_19f8 [32];
  string local_19d8 [32];
  string local_19b8 [32];
  string local_1998 [32];
  string local_1978 [32];
  string local_1958 [32];
  reference local_1938;
  string local_1928 [32];
  string local_1908 [32];
  string local_18e8 [32];
  string local_18c8 [32];
  string local_18a8 [32];
  string local_1888 [32];
  string local_1868 [32];
  string local_1848 [32];
  string local_1828 [32];
  var_bitset *local_1808;
  ulong local_1800;
  allocator local_17f1;
  string local_17f0 [32];
  string local_17d0 [32];
  string local_17b0 [32];
  string local_1790 [32];
  string local_1770 [32];
  string local_1750 [32];
  string local_1730 [32];
  string local_1710 [32];
  string local_16f0 [32];
  string local_16d0 [32];
  string local_16b0 [32];
  string local_1690 [32];
  string local_1670 [32];
  string local_1650 [32];
  string local_1630 [32];
  string local_1610 [32];
  string local_15f0 [32];
  string local_15d0 [32];
  string local_15b0 [32];
  string local_1590 [32];
  string local_1570 [32];
  string local_1550 [32];
  string local_1530 [32];
  string local_1510 [32];
  string local_14f0 [32];
  string local_14d0 [32];
  string local_14b0 [32];
  string local_1490 [32];
  string local_1470 [32];
  string local_1450 [32];
  string local_1430 [32];
  string local_1410 [32];
  string local_13f0 [32];
  string local_13d0 [32];
  string local_13b0 [32];
  string local_1390 [32];
  string local_1370 [32];
  string local_1350 [32];
  string local_1330 [32];
  string local_1310 [32];
  string local_12f0 [32];
  string local_12d0 [32];
  string local_12b0 [32];
  string local_1290 [32];
  string local_1270 [32];
  string local_1250 [32];
  string local_1230 [32];
  string local_1210 [32];
  string local_11f0 [32];
  string local_11d0 [32];
  string local_11b0 [32];
  string local_1190 [32];
  string local_1170 [32];
  string local_1150 [32];
  string local_1130 [32];
  string local_1110 [32];
  string local_10f0 [32];
  string local_10d0 [32];
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  string local_1030 [32];
  string local_1010 [32];
  Attribute *local_ff0;
  ulong local_fe8;
  string local_fe0 [32];
  string local_fc0 [39];
  allocator local_f99;
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98 [32];
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  Attribute *local_258;
  reference local_250;
  ulong local_240;
  bitset<100UL> *local_238;
  string local_230 [32];
  string local_210 [32];
  ulong local_1f0;
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  ulong local_d0;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [34];
  undefined1 local_76;
  allocator local_75 [20];
  allocator local_61;
  string *local_60;
  string local_58 [32];
  string local_38 [32];
  string asStack_18 [24];
  
  local_76 = 1;
  local_60 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58," <= ",&local_61);
  local_60 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38," == ",local_75);
  local_76 = 0;
  std::allocator<char>::~allocator((allocator<char> *)local_75);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",&local_c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_d0 = 0;
  while( true ) {
    uVar7 = local_d0;
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x228b9a);
    sVar3 = TreeDecomposition::numberOfAttributes(peVar2);
    if (sVar3 <= uVar7) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x228bd9);
    pAVar4 = TreeDecomposition::getAttribute
                       (in_stack_ffffffffffffdc70,(size_t)in_stack_ffffffffffffdc68);
    std::__cxx11::string::string(local_f0,(string *)&pAVar4->_name);
    std::operator+((char *)in_stack_ffffffffffffdca8,in_stack_ffffffffffffdca0);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::__cxx11::string::operator+=(local_98,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffdc98);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::__cxx11::string::operator+=(local_c0,local_150);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_f0);
    local_d0 = local_d0 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"",&local_191);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"",&local_1b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"",&local_1e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  local_1f0 = 0;
  while( true ) {
    uVar7 = local_1f0;
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x228fe8);
    sVar3 = TreeDecomposition::numberOfRelations(peVar2);
    if (sVar3 <= uVar7) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x229027);
    TreeDecomposition::getRelation(in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc58);
    std::operator+((char *)in_stack_ffffffffffffdca8,in_stack_ffffffffffffdca0);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::__cxx11::string::operator+=(local_190,local_210);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::operator+=(local_1e0,"\"\",");
    std::__cxx11::string::operator+=(local_1b8,"\"");
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2290ee);
    pTVar5 = TreeDecomposition::getRelation(in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc58);
    local_238 = &pTVar5->_bag;
    for (local_240 = 0; local_240 < 100; local_240 = local_240 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_ffffffffffffdc68,(size_t)in_stack_ffffffffffffdc60);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffdc60);
      std::bitset<100UL>::reference::~reference(&local_250);
      if (bVar1) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x22919b);
        local_258 = TreeDecomposition::getAttribute
                              (in_stack_ffffffffffffdc70,(size_t)in_stack_ffffffffffffdc68);
        Application::typeToStr_abi_cxx11_
                  (in_stack_ffffffffffffdca8,(Type)((ulong)in_stack_ffffffffffffdca0 >> 0x20));
        std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
        std::operator+(in_stack_ffffffffffffdc68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffdc60);
        std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
        std::__cxx11::string::operator+=(local_1b8,local_278);
        std::__cxx11::string::~string(local_278);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string(local_2b8);
        std::__cxx11::string::~string(local_2d8);
      }
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::operator+=(local_1b8,"\",");
    local_1f0 = local_1f0 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_3f8);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((char *)in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x229b0c);
  TreeDecomposition::numberOfRelations(peVar2);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffdc98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_f78);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string(local_478);
  std::__cxx11::string::~string(local_f58);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_f38);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_f18);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_ef8);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_ed8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_eb8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_e98);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_e78);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_e58);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_e38);
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_e18);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_df8);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_dd8);
  std::__cxx11::string::~string(local_818);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string(local_db8);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_d98);
  std::__cxx11::string::~string(local_898);
  std::__cxx11::string::~string(local_8b8);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_d78);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string(local_d58);
  std::__cxx11::string::~string(local_958);
  std::__cxx11::string::~string(local_978);
  std::__cxx11::string::~string(local_998);
  std::__cxx11::string::~string(local_d38);
  std::__cxx11::string::~string(local_9b8);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_d18);
  std::__cxx11::string::~string(local_9f8);
  std::__cxx11::string::~string(local_a18);
  std::__cxx11::string::~string(local_a38);
  std::__cxx11::string::~string(local_a58);
  std::__cxx11::string::~string(local_cf8);
  std::__cxx11::string::~string(local_a78);
  std::__cxx11::string::~string(local_a98);
  std::__cxx11::string::~string(local_ab8);
  std::__cxx11::string::~string(local_ad8);
  std::__cxx11::string::~string(local_cd8);
  std::__cxx11::string::~string(local_af8);
  std::__cxx11::string::~string(local_b18);
  std::__cxx11::string::~string(local_b38);
  std::__cxx11::string::~string(local_b58);
  std::__cxx11::string::~string(local_cb8);
  std::__cxx11::string::~string(local_b78);
  std::__cxx11::string::~string(local_b98);
  std::__cxx11::string::~string(local_bb8);
  std::__cxx11::string::~string(local_bd8);
  std::__cxx11::string::~string(local_c98);
  std::__cxx11::string::~string(local_bf8);
  std::__cxx11::string::~string(local_c18);
  std::__cxx11::string::~string(local_c38);
  std::__cxx11::string::~string(local_c58);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f98,"",&local_f99);
  std::allocator<char>::~allocator((allocator<char> *)&local_f99);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__cxx11::string::~string(local_fe0);
  local_fe8 = 0;
  while( true ) {
    uVar7 = local_fe8;
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x22a61b);
    sVar3 = TreeDecomposition::numberOfAttributes(peVar2);
    if (sVar3 <= uVar7) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x22a651);
    local_ff0 = TreeDecomposition::getAttribute
                          (in_stack_ffffffffffffdc70,(size_t)in_stack_ffffffffffffdc68);
    Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
    std::operator+((char *)in_stack_ffffffffffffdc68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    Application::typeToStr_abi_cxx11_
              (in_stack_ffffffffffffdca8,(Type)((ulong)in_stack_ffffffffffffdca0 >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::__cxx11::string::operator+=(local_fc0,local_1010);
    std::__cxx11::string::~string(local_1010);
    std::__cxx11::string::~string(local_1030);
    std::__cxx11::string::~string(local_1050);
    std::__cxx11::string::~string(local_1070);
    std::__cxx11::string::~string(local_10f0);
    std::__cxx11::string::~string(local_1090);
    std::__cxx11::string::~string(local_10b0);
    std::__cxx11::string::~string(local_10d0);
    Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
    Application::typeToStr_abi_cxx11_
              (in_stack_ffffffffffffdca8,(Type)((ulong)in_stack_ffffffffffffdca0 >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::__cxx11::string::operator+=(local_f98,local_1110);
    std::__cxx11::string::~string(local_1110);
    std::__cxx11::string::~string(local_1130);
    std::__cxx11::string::~string(local_1150);
    std::__cxx11::string::~string(local_1170);
    std::__cxx11::string::~string(local_11b0);
    std::__cxx11::string::~string(local_1190);
    local_fe8 = local_fe8 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((char *)in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__cxx11::string::operator+=(local_fc0,local_11d0);
  std::__cxx11::string::~string(local_11d0);
  std::__cxx11::string::~string(local_11f0);
  std::__cxx11::string::~string(local_1210);
  std::operator+((char *)in_stack_ffffffffffffdca8,in_stack_ffffffffffffdca0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__cxx11::string::~string(local_1250);
  std::__cxx11::string::~string(local_1370);
  std::__cxx11::string::~string(local_1270);
  std::__cxx11::string::~string(local_1290);
  std::__cxx11::string::~string(local_12b0);
  std::__cxx11::string::~string(local_1350);
  std::__cxx11::string::~string(local_12d0);
  std::__cxx11::string::~string(local_12f0);
  std::__cxx11::string::~string(local_1330);
  std::__cxx11::string::~string(local_1310);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((char *)in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__cxx11::string::~string(local_13b0);
  std::__cxx11::string::~string(local_17d0);
  std::__cxx11::string::~string(local_13d0);
  std::__cxx11::string::~string(local_13f0);
  std::__cxx11::string::~string(local_17b0);
  std::__cxx11::string::~string(local_1410);
  std::__cxx11::string::~string(local_1430);
  std::__cxx11::string::~string(local_1790);
  std::__cxx11::string::~string(local_1450);
  std::__cxx11::string::~string(local_1470);
  std::__cxx11::string::~string(local_1770);
  std::__cxx11::string::~string(local_1490);
  std::__cxx11::string::~string(local_14b0);
  std::__cxx11::string::~string(local_1750);
  std::__cxx11::string::~string(local_14d0);
  std::__cxx11::string::~string(local_14f0);
  std::__cxx11::string::~string(local_1730);
  std::__cxx11::string::~string(local_1510);
  std::__cxx11::string::~string(local_1530);
  std::__cxx11::string::~string(local_1710);
  std::__cxx11::string::~string(local_1550);
  std::__cxx11::string::~string(local_1570);
  std::__cxx11::string::~string(local_16f0);
  std::__cxx11::string::~string(local_1590);
  std::__cxx11::string::~string(local_15b0);
  std::__cxx11::string::~string(local_15d0);
  std::__cxx11::string::~string(local_15f0);
  std::__cxx11::string::~string(local_16d0);
  std::__cxx11::string::~string(local_1610);
  std::__cxx11::string::~string(local_1630);
  std::__cxx11::string::~string(local_16b0);
  std::__cxx11::string::~string(local_1650);
  std::__cxx11::string::~string(local_1670);
  std::__cxx11::string::~string(local_1690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17f0,"",&local_17f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_17f1);
  local_1800 = 0;
  while( true ) {
    uVar7 = local_1800;
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x22c30a);
    sVar3 = TreeDecomposition::numberOfAttributes(peVar2);
    if (sVar3 <= uVar7) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x22c340);
    in_stack_ffffffffffffdc98 =
         (Application *)
         TreeDecomposition::getAttribute
                   (in_stack_ffffffffffffdc70,(size_t)in_stack_ffffffffffffdc68);
    local_1808 = &in_stack_ffffffffffffdc98->_features;
    Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffdc98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdc60);
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_ffffffffffffdc68,(size_t)in_stack_ffffffffffffdc60);
    std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdc60);
    std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
    std::__cxx11::string::operator+=(local_17f0,local_1828);
    std::__cxx11::string::~string(local_1828);
    std::__cxx11::string::~string(local_1848);
    std::bitset<100UL>::reference::~reference(&local_1938);
    std::__cxx11::string::~string(local_1868);
    std::__cxx11::string::~string(local_1888);
    std::__cxx11::string::~string(local_18a8);
    std::__cxx11::string::~string(local_18c8);
    std::__cxx11::string::~string(local_1928);
    std::__cxx11::string::~string(local_18e8);
    std::__cxx11::string::~string(local_1908);
    local_1800 = local_1800 + 1;
  }
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((char *)in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__cxx11::string::~string(local_1978);
  std::__cxx11::string::~string(local_1d78);
  std::__cxx11::string::~string(local_1998);
  std::__cxx11::string::~string(local_19b8);
  std::__cxx11::string::~string(local_1d58);
  std::__cxx11::string::~string(local_19d8);
  std::__cxx11::string::~string(local_19f8);
  std::__cxx11::string::~string(local_1d38);
  std::__cxx11::string::~string(local_1a18);
  std::__cxx11::string::~string(local_1a38);
  std::__cxx11::string::~string(local_1d18);
  std::__cxx11::string::~string(local_1a58);
  std::__cxx11::string::~string(local_1a78);
  std::__cxx11::string::~string(local_1cf8);
  std::__cxx11::string::~string(local_1a98);
  std::__cxx11::string::~string(local_1ab8);
  std::__cxx11::string::~string(local_1ad8);
  std::__cxx11::string::~string(local_1cd8);
  std::__cxx11::string::~string(local_1af8);
  std::__cxx11::string::~string(local_1b18);
  std::__cxx11::string::~string(local_1cb8);
  std::__cxx11::string::~string(local_1b38);
  std::__cxx11::string::~string(local_1b58);
  std::__cxx11::string::~string(local_1c98);
  std::__cxx11::string::~string(local_1b78);
  std::__cxx11::string::~string(local_1b98);
  std::__cxx11::string::~string(local_1c78);
  std::__cxx11::string::~string(local_1bb8);
  std::__cxx11::string::~string(local_1bd8);
  std::__cxx11::string::~string(local_1c58);
  std::__cxx11::string::~string(local_1bf8);
  std::__cxx11::string::~string(local_1c18);
  std::__cxx11::string::~string(local_1c38);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((char *)in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)in_stack_ffffffffffffdc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22d628);
  pAVar4 = TreeDecomposition::getAttribute
                     (in_stack_ffffffffffffdc70,(size_t)in_stack_ffffffffffffdc68);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)pAVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar4);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)pAVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar4);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)pAVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar4);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffdc98,(size_t)pAVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar4);
  std::operator+(in_stack_ffffffffffffdc68,(char *)in_stack_ffffffffffffdc60);
  std::__cxx11::string::~string(local_1db8);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string(local_1dd8);
  std::__cxx11::string::~string(local_1df8);
  std::__cxx11::string::~string(local_21b8);
  std::__cxx11::string::~string(local_1e18);
  std::__cxx11::string::~string(local_1e38);
  std::__cxx11::string::~string(local_2198);
  std::__cxx11::string::~string(local_1e58);
  std::__cxx11::string::~string(local_1e78);
  std::__cxx11::string::~string(local_2178);
  std::__cxx11::string::~string(local_1e98);
  std::__cxx11::string::~string(local_1eb8);
  std::__cxx11::string::~string(local_1ed8);
  std::__cxx11::string::~string(local_1ef8);
  std::__cxx11::string::~string(local_2158);
  std::__cxx11::string::~string(local_1f18);
  std::__cxx11::string::~string(local_1f38);
  std::__cxx11::string::~string(local_2138);
  std::__cxx11::string::~string(local_1f58);
  std::__cxx11::string::~string(local_1f78);
  std::__cxx11::string::~string(local_2118);
  std::__cxx11::string::~string(local_1f98);
  std::__cxx11::string::~string(local_1fb8);
  std::__cxx11::string::~string(local_20f8);
  std::__cxx11::string::~string(local_1fd8);
  std::__cxx11::string::~string(local_1ff8);
  std::__cxx11::string::~string(local_20d8);
  std::__cxx11::string::~string(local_2018);
  std::__cxx11::string::~string(local_2038);
  std::__cxx11::string::~string(local_20b8);
  std::__cxx11::string::~string(local_2058);
  std::__cxx11::string::~string(local_2078);
  std::__cxx11::string::~string(local_2098);
  std::operator+(in_stack_ffffffffffffdc88,in_stack_ffffffffffffdc80);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::operator+(in_stack_ffffffffffffdc68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdc60);
  std::__cxx11::string::~string(local_21f8);
  std::__cxx11::string::~string(local_2218);
  std::__cxx11::string::~string(local_2238);
  std::__cxx11::string::~string(local_2258);
  std::__cxx11::string::~string(local_1d98);
  std::__cxx11::string::~string(local_1958);
  std::__cxx11::string::~string(local_17f0);
  std::__cxx11::string::~string(local_1390);
  std::__cxx11::string::~string(local_1230);
  std::__cxx11::string::~string(local_fc0);
  std::__cxx11::string::~string(local_f98);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_98);
  psVar6 = local_58;
  this_00 = asStack_18;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar6);
  return in_RDI;
}

Assistant:

std::string RegressionTree::dynamicFunctionsGenerator()
{
    std::string condition[] = {" <= "," == "};
    
    std::string varList = "", relationMap = ""; 
    for (size_t var = 0; var< _td->numberOfAttributes(); ++var)
    {
        const std::string varName = _td->getAttribute(var)->_name;

	varList += "\""+varName+"\","; 
	relationMap += std::to_string(_queryRootIndex[var])+",";        
    }
    varList.pop_back();
    relationMap.pop_back();
    
    std::string relationName = "", varTypeList = "", conditionsString = ""; 
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
	relationName += "\""+_td->getRelation(rel)->_name+"\",";
        conditionsString += "\"\",";

        varTypeList += "\"";

        var_bitset& bag = _td->getRelation(rel)->_bag;
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (bag[var])
            {
                Attribute* att = _td->getAttribute(var);
                varTypeList += typeToStr(att->_type)+" "+att->_name+",";
            }
        }
        varTypeList.pop_back();
        varTypeList += "\",";
    }
    relationName.pop_back();
    conditionsString.pop_back();
    varTypeList.pop_back();
    
    std::string headerFiles =offset(0)+
        "#include <fstream>\n"+
        "#include <vector>\n"+
        "#include \"RegressionTreeNode.hpp\"\n\n"+
        "#include <boost/spirit/include/qi.hpp>\n"+
        "#include <boost/spirit/include/phoenix_core.hpp>\n"+
        "#include <boost/spirit/include/phoenix_operator.hpp>\n\n"+
        "namespace qi = boost::spirit::qi;\n"+
        "namespace phoenix = boost::phoenix;\n\n";
    
    std::string genDynFuncs =
        "void generateDynamicFunctions(std::vector<Condition>& conditions)\n{\n"+
	offset(1)+"std::string variableMap[] = {"+varList+"};\n"+
	offset(1)+"std::string variableList[] = {"+varTypeList+"};\n"+
	offset(1)+"size_t relationMap[] = {"+relationMap+"};\n"+
	offset(1)+"std::string relationName[] = {"+relationName+"};\n"+
        offset(1)+"std::string conditionStr[] = {"+conditionsString+"};\n"+
        offset(1)+"for (Condition& c : conditions)\n"+
        offset(2)+"conditionStr[relationMap[c.variable]] += variableMap[c.variable] + "+
        "c.op + std::to_string(c.threshold) + \"&&\";\n"+
        offset(1)+"std::ofstream ofs(\"DynamicFunctions.cpp\", "+
        "std::ofstream::out);\n"+
        offset(1)+"ofs << \"#include \\\"DynamicFunctions.h\\\"\\n"+
        "namespace lmfao\\n{\\n\";\n"+
        offset(1)+"for (size_t rel = 0; rel < "+
        std::to_string(_td->numberOfRelations())+"; ++rel)\n"+offset(1)+"{\n"+
        offset(2)+"if (!conditionStr[rel].empty())\n"+offset(2)+"{\n"+
        offset(3)+"conditionStr[rel].pop_back();\n"+
        offset(3)+"conditionStr[rel].pop_back();\n"+
        offset(3)+"ofs << \"double f_\"+relationName[rel]+\"(\"+"+
        "variableList[rel]+\")\\n"+
        "{\\n\treturn (\"+conditionStr[rel]+\" ? 1.0 : 0.0);\\n}\\n\";\n"+
        offset(2)+"}\n"+offset(2)+"else\n"+offset(2)+"{\n"+
        offset(3)+"ofs << \"double f_\"+relationName[rel]+"+
        "\"(\"+variableList[rel]+\")\\n"+
        "{\\n\\treturn 1.0;\\n}\\n\";\n"+
        offset(2)+"}\n"+offset(1)+"}\n"+
        offset(1)+"ofs << \"}\\n\";\n"+offset(1)+"ofs.close();\n}\n";


    /********************************************************/
    /************ This is for loading Test Data *************/
    /********************************************************/
    
    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the SQL generator as well.
    std::string attributeString = "",
        attrConstruct = offset(3)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(4)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(1)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(4)+"\'|\');\n";

    std::string testTuple = "\nstruct Test_tuple\n{\n"+
        attributeString+offset(1)+"Test_tuple(const std::string& tuple)\n"+
        offset(1)+"{\n"+attrConstruct+offset(1)+"}\n};\n\n";

    std::string loadFunction =
        "void loadTestDataset(std::vector<Test_tuple>& TestDataset)\n{\n"+
        offset(1)+"std::ifstream input;\n"+offset(1)+"std::string line;\n"+
        offset(1)+"input.open(\""+PATH_TO_DATA+"/test_data.tbl\");\n"+
        offset(1)+"if (!input)\n"+offset(1)+"{\n"+
        offset(2)+"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n"+
        offset(2)+"exit(1);\n"+offset(1)+"}\n"+
        offset(1)+"while(getline(input, line))\n"+
        offset(2)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(1)+"input.close();\n}\n\n";
    

    /****************************************************************/
    /************ This is for finding prediction & eval *************/
    /****************************************************************/

    std::string findPredSwitch=""; 
    for (size_t var = 0; var< _td->numberOfAttributes(); ++var)
    {
        const std::string& varName = _td->getAttribute(var)->_name;
        findPredSwitch += offset(3)+"case "+std::to_string(var)+" : "+
            "goLeft = (tuple."+varName+condition[_categoricalFeatures[var]]+
            "c.threshold); break;\n";       
    }
    
    std::string findPrediction =
        "double findPrediction(const RegTreeNode* node, const Test_tuple& tuple)\n{\n"+
        offset(1)+"if (node->isLeaf)\n"+
        offset(2)+"return node->prediction;\n\n"+
        offset(1)+"bool goLeft = true;\n"+
        offset(1)+"const Condition& c = node->condition;\n"+
        offset(1)+"switch (c.variable)\n"+
        offset(1)+"{\n"+findPredSwitch+offset(1)+"}\n"+
        offset(1)+"if (goLeft)\n"+
        offset(2)+"return findPrediction(node->lchild, tuple);\n"+
        offset(1)+"else\n"+
        offset(2)+"return findPrediction(node->rchild, tuple);\n}\n\n";
    
    std::string evalFunction = "void evaluateModel(const RegTreeNode* root)\n{\n"+
        offset(1)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(1)+"loadTestDataset(TestDataset);\n"+
        offset(1)+"double pred, diff, error = 0.0;\n"+
        offset(1)+"for (const Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(2)+"pred = findPrediction(root, tuple);\n"+
        offset(2)+"diff = tuple."+_td->getAttribute(_labelID)->_name+"-pred;\n"+
        offset(2)+"error += diff * diff;\n"+
        offset(1)+"}\n"+
        offset(1)+"error /= TestDataset.size();\n"+
        offset(1)+"std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n}\n\n";
    
    return headerFiles+testTuple+loadFunction+findPrediction+evalFunction+genDynFuncs;
}